

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

uint8 * google::protobuf::internal::SerializeInternalToArray
                  (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
                  bool is_deterministic,uint8 *buffer)

{
  uint uVar1;
  int iVar2;
  ArrayOutput *output_00;
  ulong uVar3;
  SingularFieldHelper<11> *this;
  uint32 *has_bits_array;
  bool bVar4;
  ArrayOutput array_output;
  ArrayOutputStream array_stream;
  CodedOutputStream output;
  
  uVar3 = 0;
  array_output.ptr = buffer;
  array_output.is_deterministic = is_deterministic;
  if (0 < num_fields) {
    uVar3 = (ulong)(uint)num_fields;
  }
  do {
    bVar4 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar4) {
      return array_output.ptr;
    }
    uVar1 = field_metadata_table->type;
    if (100 < (ulong)uVar1) {
switchD_0020b1bc_caseD_12:
      SerializeNotImplemented(uVar1);
      goto LAB_0020b9b1;
    }
    this = (SingularFieldHelper<11> *)(base + field_metadata_table->offset);
    output_00 = (ArrayOutput *)
                ((long)&switchD_0020b1bc::switchdataD_0027c09c +
                (long)(int)(&switchD_0020b1bc::switchdataD_0027c09c)[uVar1]);
    switch(uVar1) {
    case 0:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b645:
        SingularFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 1:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b684:
        SingularFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 2:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b8a6:
        SingularFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 3:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b5af:
        SingularFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 4:
      uVar1 = *(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
              (field_metadata_table->has_offset & 0x1f) & 1;
      goto joined_r0x0020b624;
    case 5:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b55a:
        SingularFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 6:
      uVar1 = *(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
              (field_metadata_table->has_offset & 0x1f) & 1;
      goto joined_r0x0020b71a;
    case 7:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b4eb:
        SingularFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 8:
    case 0xb:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b20f:
        SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 9:
      output_00 = (ArrayOutput *)
                  (ulong)*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4);
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b747:
        SingularFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((SingularFieldHelper<10> *)this,field_metadata_table,
                   (FieldMetadata *)&array_output,output_00);
      }
      break;
    case 10:
      output_00 = (ArrayOutput *)
                  (ulong)*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4);
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b6be:
        SingularFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,(FieldMetadata *)&array_output,output_00);
      }
      break;
    case 0xc:
      uVar1 = *(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
              (field_metadata_table->has_offset & 0x1f) & 1;
      goto joined_r0x0020b780;
    case 0xd:
      uVar1 = *(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
              (field_metadata_table->has_offset & 0x1f) & 1;
      goto joined_r0x0020b609;
    case 0xe:
      uVar1 = *(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
              (field_metadata_table->has_offset & 0x1f) & 1;
      goto joined_r0x0020b3e6;
    case 0xf:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b7db:
        SingularFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x10:
      uVar1 = *(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
              (field_metadata_table->has_offset & 0x1f) & 1;
      goto joined_r0x0020b7f0;
    case 0x11:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0020b8f8:
        SingularFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    default:
      goto switchD_0020b1bc_caseD_12;
    case 0x14:
      if ((*(double *)this != 0.0) || (NAN(*(double *)this))) goto LAB_0020b645;
      break;
    case 0x15:
      if ((*(float *)this != 0.0) || (NAN(*(float *)this))) goto LAB_0020b684;
      break;
    case 0x16:
      if (*(long *)this != 0) goto LAB_0020b8a6;
      break;
    case 0x17:
      if (*(long *)this != 0) goto LAB_0020b5af;
      break;
    case 0x18:
      uVar1 = *(uint *)this;
joined_r0x0020b624:
      if (uVar1 != 0) {
LAB_0020b99b:
        SingularFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x19:
      if (*(long *)this != 0) goto LAB_0020b55a;
      break;
    case 0x1a:
      uVar1 = *(uint *)this;
joined_r0x0020b71a:
      if (uVar1 != 0) {
LAB_0020b720:
        SingularFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x1b:
      if (*this != (SingularFieldHelper<11>)0x0) goto LAB_0020b4eb;
      break;
    case 0x1c:
    case 0x1f:
      if (*(long *)((*(ulong *)this & 0xfffffffffffffffe) + 8) != 0) goto LAB_0020b20f;
      break;
    case 0x1d:
      if (*(long *)this != 0) goto LAB_0020b747;
      break;
    case 0x1e:
      if (*(long *)this != 0) goto LAB_0020b6be;
      break;
    case 0x20:
      uVar1 = *(uint *)this;
joined_r0x0020b780:
      if (uVar1 != 0) {
LAB_0020b786:
        SingularFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x21:
      uVar1 = *(uint *)this;
joined_r0x0020b609:
      if (uVar1 != 0) {
LAB_0020b60f:
        SingularFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x22:
      uVar1 = *(uint *)this;
joined_r0x0020b3e6:
      if (uVar1 != 0) {
LAB_0020b94e:
        SingularFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x23:
      if (*(long *)this != 0) goto LAB_0020b7db;
      break;
    case 0x24:
      uVar1 = *(uint *)this;
joined_r0x0020b7f0:
      if (uVar1 != 0) {
LAB_0020b842:
        SingularFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x25:
      if (*(long *)this != 0) goto LAB_0020b8f8;
      break;
    case 0x28:
      RepeatedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x29:
      RepeatedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x2a:
      RepeatedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x2b:
      RepeatedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x2c:
      RepeatedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x2d:
      RepeatedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x2e:
      RepeatedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x2f:
      RepeatedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x30:
    case 0x33:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x31:
      RepeatedFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x32:
      RepeatedFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x34:
      RepeatedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x35:
      RepeatedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x36:
      RepeatedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x37:
      RepeatedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x38:
      RepeatedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x39:
      RepeatedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x3c:
      PackedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x3d:
      PackedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x3e:
      PackedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x3f:
      PackedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x40:
      PackedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x41:
      PackedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x42:
      PackedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x43:
      PackedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
      PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x48:
      PackedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x49:
      PackedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x4a:
      PackedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x4b:
      PackedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x4c:
      PackedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x4d:
      PackedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x50:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020b645;
      break;
    case 0x51:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020b684;
      break;
    case 0x52:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020b8a6;
      break;
    case 0x53:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020b5af;
      break;
    case 0x54:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0020b99b;
    case 0x55:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020b55a;
      break;
    case 0x56:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0020b720;
    case 0x57:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020b4eb;
      break;
    case 0x58:
    case 0x5b:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020b20f;
      break;
    case 0x59:
      output_00 = (ArrayOutput *)(ulong)field_metadata_table->has_offset;
      if (*(uint *)(base + (long)output_00) == field_metadata_table->tag >> 3) goto LAB_0020b747;
      break;
    case 0x5a:
      output_00 = (ArrayOutput *)(ulong)field_metadata_table->has_offset;
      if (*(uint *)(base + (long)output_00) == field_metadata_table->tag >> 3) goto LAB_0020b6be;
      break;
    case 0x5c:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0020b786;
    case 0x5d:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0020b60f;
    case 0x5e:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0020b94e;
    case 0x5f:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020b7db;
      break;
    case 0x60:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0020b842;
    case 0x61:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0020b8f8;
      break;
    case 100:
      io::ArrayOutputStream::ArrayOutputStream(&array_stream,array_output.ptr,0x7fffffff,-1);
      io::CodedOutputStream::CodedOutputStream(&output,&array_stream.super_ZeroCopyOutputStream);
      output.impl_.is_serialization_deterministic_ = is_deterministic;
      (*(code *)field_metadata_table->ptr)
                (base,field_metadata_table->offset,field_metadata_table->tag,
                 field_metadata_table->has_offset,&output);
      iVar2 = io::CodedOutputStream::ByteCount(&output);
      array_output.ptr = array_output.ptr + iVar2;
      io::CodedOutputStream::~CodedOutputStream(&output);
    }
LAB_0020b9b1:
    field_metadata_table = field_metadata_table + 1;
  } while( true );
}

Assistant:

uint8* SerializeInternalToArray(const uint8* base,
                                const FieldMetadata* field_metadata_table,
                                int32 num_fields, bool is_deterministic,
                                uint8* buffer) {
  ArrayOutput array_output = {buffer, is_deterministic};
  ArrayOutput* output = &array_output;
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);
      // Special cases
      case FieldMetadata::kSpecial: {
        io::ArrayOutputStream array_stream(array_output.ptr, INT_MAX);
        io::CodedOutputStream output(&array_stream);
        output.SetSerializationDeterministic(is_deterministic);
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, &output);
        array_output.ptr += output.ByteCount();
      } break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
  return array_output.ptr;
}